

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::readScanline<Imf_3_2::InputFile>
               (InputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  bool bVar2;
  pointer puVar3;
  pointer pfVar4;
  pointer phVar5;
  int iVar6;
  int *piVar7;
  Header *pHVar8;
  Compression *pCVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  size_type __n;
  ulong uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  FrameBuffer i;
  allocator_type local_68 [56];
  
  Imf_3_2::InputFile::header();
  piVar7 = (int *)Imf_3_2::Header::dataWindow();
  iVar6 = piVar7[2];
  iVar1 = *piVar7;
  pHVar8 = (Header *)Imf_3_2::InputFile::header();
  Imf_3_2::calculateBytesPerPixel(pHVar8);
  Imf_3_2::InputFile::header();
  pCVar9 = (Compression *)Imf_3_2::Header::compression();
  Imf_3_2::numLinesInBuffer(*pCVar9);
  __n = ((long)iVar6 - (long)iVar1) + 1;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector(&halfChannels,__n,local_68)
  ;
  std::vector<float,_std::allocator<float>_>::vector(&floatChannels,__n,(allocator_type *)local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&uintChannels,__n,(allocator_type *)local_68);
  phVar5 = halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar4 = floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::channels();
  p_Var10 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  uVar12 = 0;
  for (; p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var10 != p_Var11;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    iVar6 = (int)uVar12 + (int)(uVar12 / 3) * -3;
    if (iVar6 == 2) {
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,UINT,
                 (char *)(puVar3 + -(long)(iVar1 / *(int *)&p_Var10[9].field_0x4)),4,0,
                 *(int *)&p_Var10[9].field_0x4,*(int *)&p_Var10[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var10 + 1));
    }
    else if (iVar6 == 1) {
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,FLOAT,
                 (char *)(pfVar4 + -(long)(iVar1 / *(int *)&p_Var10[9].field_0x4)),4,0,
                 *(int *)&p_Var10[9].field_0x4,*(int *)&p_Var10[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var10 + 1));
    }
    else {
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,HALF,
                 (char *)(phVar5 + -(long)(iVar1 / *(int *)&p_Var10[9].field_0x4)),2,0,
                 *(int *)&p_Var10[9].field_0x4,*(int *)&p_Var10[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var10 + 1));
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  }
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)in);
  iVar6 = piVar7[1];
  if (iVar6 <= piVar7[3]) {
    do {
      Imf_3_2::InputFile::readPixels((int)in);
      bVar2 = iVar6 < piVar7[3];
      iVar6 = iVar6 + 1;
    } while (bVar2);
  }
  if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)uintChannels.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)uintChannels.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)halfChannels.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)halfChannels.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&i);
  return false;
}

Assistant:

bool
readScanline (T& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;

    try
    {
        const Box2i& dw = in.header ().dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int      dx            = dw.min.x;
        uint64_t bytesPerPixel = calculateBytesPerPixel (in.header ());
        uint64_t numLines      = numLinesInBuffer (in.header ().compression ());

        if (reduceMemory && w * bytesPerPixel * numLines > gMaxBytesPerScanline)
        {
            return false;
        }

        FrameBuffer i;

        // read all channels present (later channels will overwrite earlier ones)
        vector<half>         halfChannels (w);
        vector<float>        floatChannels (w);
        vector<unsigned int> uintChannels (w);

        intptr_t halfData  = reinterpret_cast<intptr_t> (halfChannels.data ());
        intptr_t floatData = reinterpret_cast<intptr_t> (floatChannels.data ());
        intptr_t uintData  = reinterpret_cast<intptr_t> (uintChannels.data ());

        int                channelIndex = 0;
        const ChannelList& channelList  = in.header ().channels ();
        for (ChannelList::ConstIterator c = channelList.begin ();
             c != channelList.end ();
             ++c)
        {
            switch (channelIndex % 3)
            {
                case 0:
                    i.insert(c.name(),Slice(HALF, (char*) (halfData - sizeof(half)*(dx/c.channel().xSampling))  , sizeof(half) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
                case 1:
                    i.insert(c.name(),Slice(FLOAT, (char*) (floatData - sizeof(float)*(dx/c.channel().xSampling))  , sizeof(float) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
                case 2:
                    i.insert(c.name(),Slice(UINT, (char*) (uintData - sizeof(unsigned int)*(dx/c.channel().xSampling))  , sizeof(unsigned int) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
            }
            channelIndex++;
        }

        in.setFrameBuffer (i);

        int step = 1;

        //
        // try reading scanlines. Continue reading scanlines
        // even if an exception is encountered
        //
        for (int y = dw.min.y; y <= dw.max.y; y += step)
        {
            try
            {
                in.readPixels (y);
            }
            catch (...)
            {
                threw = true;

                //
                // in reduceTime mode, fail immediately - the file is corrupt
                //
                if (reduceTime) { return threw; }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }

    return threw;
}